

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct-utils.h
# Opt level: O3

StructValues<wasm::(anonymous_namespace)::Bool> * __thiscall
wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::Bool>::operator[]
          (StructValuesMap<wasm::(anonymous_namespace)::Bool> *this,HeapType type)

{
  __node_base *p_Var1;
  size_type *psVar2;
  __node_base_ptr p_Var3;
  __buckets_ptr pp_Var4;
  void *__s;
  undefined1 *puVar5;
  undefined1 *puVar6;
  HeapType HVar7;
  HeapTypeKind HVar8;
  _Hash_node_base *p_Var9;
  _Hash_node_base *p_Var10;
  __node_base_ptr *__s_00;
  __node_base_ptr *pp_Var11;
  Struct *pSVar12;
  pointer pBVar13;
  void *pvVar14;
  pointer pBVar15;
  ulong uVar16;
  size_type __n;
  ulong uVar17;
  undefined1 *puVar18;
  _Vector_base<wasm::(anonymous_namespace)::Bool,_std::allocator<wasm::(anonymous_namespace)::Bool>_>
  *this_00;
  _Hash_node_base _Var20;
  __node_ptr __n_00;
  _Hash_node_base *p_Var21;
  ulong __n_01;
  undefined1 auVar22 [16];
  _Hash_node_base local_50;
  HeapType type_local;
  new_allocator<std::__detail::_Hash_node_base_*> local_31 [8];
  __buckets_alloc_type __alloc;
  ulong uVar19;
  
  local_50._M_nxt = (_Hash_node_base *)type.id;
  HVar8 = HeapType::getKind((HeapType *)&local_50);
  _Var20._M_nxt = local_50._M_nxt;
  if (HVar8 != Struct) {
    __assert_fail("type.isStruct()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/struct-utils.h"
                  ,0x3a,
                  "StructValues<T> &wasm::StructUtils::StructValuesMap<wasm::(anonymous namespace)::Bool>::operator[](HeapType) [T = wasm::(anonymous namespace)::Bool]"
                 );
  }
  p_Var9 = (_Hash_node_base *)
           std::
           _Vector_base<wasm::(anonymous_namespace)::Bool,_std::allocator<wasm::(anonymous_namespace)::Bool>_>
           ::_M_allocate((_Vector_base<wasm::(anonymous_namespace)::Bool,_std::allocator<wasm::(anonymous_namespace)::Bool>_>
                          *)0x0,type.id);
  p_Var10 = (_Hash_node_base *)operator_new(0x30);
  p_Var10->_M_nxt = (_Hash_node_base *)0x0;
  p_Var10[1]._M_nxt = _Var20._M_nxt;
  p_Var10[2]._M_nxt = p_Var9;
  p_Var10[3]._M_nxt = p_Var9;
  p_Var10[4]._M_nxt = p_Var9;
  type_local.id = (uintptr_t)p_Var10;
  p_Var9 = (_Hash_node_base *)
           std::hash<wasm::HeapType>::operator()
                     ((hash<wasm::HeapType> *)this,(HeapType *)(p_Var10 + 1));
  __n_00 = (__node_ptr)
           (this->
           super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>_>
           )._M_h._M_bucket_count;
  uVar16 = (ulong)p_Var9 % (ulong)__n_00;
  p_Var3 = (this->
           super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>_>
           )._M_h._M_buckets[uVar16];
  if (p_Var3 == (__node_base_ptr)0x0) {
LAB_00814bba:
    auVar22 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                        ((ulong)&(this->
                                 super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>_>
                                 )._M_h._M_rehash_policy,(ulong)__n_00,
                         (this->
                         super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>_>
                         )._M_h._M_element_count);
    __n = auVar22._8_8_;
    if ((auVar22 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      __s_00 = (this->
               super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>_>
               )._M_h._M_buckets;
    }
    else {
      if (__n == 1) {
        __s_00 = &(this->
                  super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>_>
                  )._M_h._M_single_bucket;
        (this->
        super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>_>
        )._M_h._M_single_bucket = (__node_base_ptr)0x0;
      }
      else {
        __s_00 = __gnu_cxx::new_allocator<std::__detail::_Hash_node_base_*>::allocate
                           (local_31,__n,(void *)0x0);
        memset(__s_00,0,__n * 8);
      }
      __n_00 = (__node_ptr)
               (this->
               super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>_>
               )._M_h._M_before_begin._M_nxt;
      (this->
      super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>_>
      )._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      if (__n_00 != (__node_ptr)0x0) {
        p_Var1 = &(this->
                  super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>_>
                  )._M_h._M_before_begin;
        _Var20._M_nxt = (_Hash_node_base *)__n_00;
        uVar16 = 0;
        do {
          __n_00 = (__node_ptr)((_Hash_node_base *)&(_Var20._M_nxt)->_M_nxt)->_M_nxt;
          uVar17 = ((_Hash_node_code_cache<true> *)(_Var20._M_nxt + 5))->_M_hash_code % __n;
          if (__s_00[uVar17] == (_Hash_node_base *)0x0) {
            ((_Hash_node_base *)&(_Var20._M_nxt)->_M_nxt)->_M_nxt = p_Var1->_M_nxt;
            p_Var1->_M_nxt = _Var20._M_nxt;
            __s_00[uVar17] = p_Var1;
            if (((_Hash_node_base *)&(_Var20._M_nxt)->_M_nxt)->_M_nxt != (_Hash_node_base *)0x0) {
              pp_Var11 = __s_00 + uVar16;
              goto LAB_00814c69;
            }
          }
          else {
            ((_Hash_node_base *)&(_Var20._M_nxt)->_M_nxt)->_M_nxt = __s_00[uVar17]->_M_nxt;
            pp_Var11 = &__s_00[uVar17]->_M_nxt;
            uVar17 = uVar16;
LAB_00814c69:
            *pp_Var11 = _Var20._M_nxt;
          }
          _Var20._M_nxt = (_Hash_node_base *)__n_00;
          uVar16 = uVar17;
        } while (__n_00 != (__node_ptr)0x0);
      }
      pp_Var4 = (this->
                super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>_>
                )._M_h._M_buckets;
      if (&(this->
           super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>_>
           )._M_h._M_single_bucket != pp_Var4) {
        __n_00 = (__node_ptr)
                 ((this->
                  super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>_>
                  )._M_h._M_bucket_count << 3);
        operator_delete(pp_Var4,(ulong)__n_00);
      }
      (this->
      super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>_>
      )._M_h._M_bucket_count = __n;
      (this->
      super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>_>
      )._M_h._M_buckets = __s_00;
      uVar16 = (ulong)p_Var9 % __n;
    }
    HVar7.id = type_local.id;
    *(_Hash_node_base **)(type_local.id + 0x28) = p_Var9;
    if (__s_00[uVar16] == (_Hash_node_base *)0x0) {
      p_Var9 = (this->
               super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>_>
               )._M_h._M_before_begin._M_nxt;
      *(_Hash_node_base **)type_local.id = p_Var9;
      (this->
      super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>_>
      )._M_h._M_before_begin._M_nxt = (_Hash_node_base *)type_local.id;
      if (p_Var9 != (_Hash_node_base *)0x0) {
        __s_00[(ulong)p_Var9[5]._M_nxt %
               (this->
               super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>_>
               )._M_h._M_bucket_count] = (__node_base_ptr)type_local.id;
        __s_00 = (this->
                 super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>_>
                 )._M_h._M_buckets;
      }
      __s_00[uVar16] =
           &(this->
            super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>_>
            )._M_h._M_before_begin;
    }
    else {
      *(_Hash_node_base **)type_local.id = __s_00[uVar16]->_M_nxt;
      __s_00[uVar16]->_M_nxt = (_Hash_node_base *)type_local.id;
    }
    psVar2 = &(this->
              super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>_>
              )._M_h._M_element_count;
    *psVar2 = *psVar2 + 1;
    pSVar12 = HeapType::getStruct((HeapType *)&local_50);
    uVar17 = (long)(pSVar12->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(pSVar12->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 4;
    __s = *(void **)(HVar7.id + 0x18);
    uVar16 = (long)__s - *(long *)(HVar7.id + 0x10);
    __n_01 = uVar17 - uVar16;
    if (uVar17 < uVar16 || __n_01 == 0) {
      if ((uVar17 < uVar16) &&
         (pvVar14 = (void *)(*(long *)(HVar7.id + 0x10) + uVar17), __s != pvVar14)) {
        *(void **)(HVar7.id + 0x18) = pvVar14;
      }
    }
    else if ((ulong)(*(long *)(HVar7.id + 0x20) - (long)__s) < __n_01) {
      if ((uVar16 ^ 0x7fffffffffffffff) < __n_01) {
        std::__throw_length_error("vector::_M_default_append");
      }
      uVar19 = __n_01;
      if (__n_01 < uVar16) {
        uVar19 = uVar16;
      }
      this_00 = (_Vector_base<wasm::(anonymous_namespace)::Bool,_std::allocator<wasm::(anonymous_namespace)::Bool>_>
                 *)(uVar19 + uVar16);
      if ((_Vector_base<wasm::(anonymous_namespace)::Bool,_std::allocator<wasm::(anonymous_namespace)::Bool>_>
           *)0x7ffffffffffffffe < this_00) {
        this_00 = (_Vector_base<wasm::(anonymous_namespace)::Bool,_std::allocator<wasm::(anonymous_namespace)::Bool>_>
                   *)0x7fffffffffffffff;
      }
      pBVar13 = std::
                _Vector_base<wasm::(anonymous_namespace)::Bool,_std::allocator<wasm::(anonymous_namespace)::Bool>_>
                ::_M_allocate(this_00,(size_t)__n_00);
      memset(pBVar13 + uVar16,0,__n_01);
      HVar7 = type_local;
      puVar6 = *(undefined1 **)(type_local.id + 0x18);
      puVar5 = *(undefined1 **)(type_local.id + 0x10);
      pBVar15 = pBVar13;
      for (puVar18 = puVar5; puVar18 != puVar6; puVar18 = puVar18 + 1) {
        pBVar15->value = (bool)*puVar18;
        pBVar15 = pBVar15 + 1;
      }
      if (puVar5 != (undefined1 *)0x0) {
        operator_delete(puVar5,*(long *)(type_local.id + 0x20) - (long)puVar5);
      }
      *(pointer *)(HVar7.id + 0x10) = pBVar13;
      *(pointer *)(HVar7.id + 0x18) = pBVar13 + uVar17;
      *(pointer *)(HVar7.id + 0x20) = pBVar13 + (long)&this_00->_M_impl;
    }
    else {
      memset(__s,0,__n_01);
      *(ulong *)(HVar7.id + 0x18) = (long)__s + __n_01;
    }
  }
  else {
    p_Var21 = p_Var3->_M_nxt;
    if (p_Var21[5]._M_nxt == p_Var9) goto LAB_00814b9f;
    do {
      do {
        p_Var21 = p_Var21->_M_nxt;
        if ((p_Var21 == (_Hash_node_base *)0x0) ||
           ((ulong)p_Var21[5]._M_nxt % (ulong)__n_00 != uVar16)) goto LAB_00814bba;
      } while (p_Var21[5]._M_nxt != p_Var9);
LAB_00814b9f:
    } while (p_Var21[1]._M_nxt != p_Var10[1]._M_nxt);
    std::__detail::
    _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>,_true>_>_>
    ::_M_deallocate_node
              ((_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>,_true>_>_>
                *)type_local.id,__n_00);
    p_Var10 = p_Var21;
  }
  return (StructValues<wasm::(anonymous_namespace)::Bool> *)(p_Var10 + 2);
}

Assistant:

StructValues<T>& operator[](HeapType type) {
    assert(type.isStruct());
    auto inserted = this->insert({type, {}});
    auto& values = inserted.first->second;
    if (inserted.second) {
      values.resize(type.getStruct().fields.size());
    }
    return values;
  }